

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  double dVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  interval_t iVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  int64_t *piVar11;
  idx_t idx_in_entry_1;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  interval_t iVar17;
  interval_t iVar18;
  int64_t *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  ValidityMask *local_88;
  _Head_base<0UL,_unsigned_long_*,_false> local_80;
  interval_t *local_78;
  ulong local_70;
  double *local_68;
  idx_t local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  double *local_38;
  
  local_78 = ldata;
  local_68 = rdata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar5 = *ldata;
      iVar17 = *ldata;
      local_a0 = &result_data->micros;
      uVar16 = 0;
      do {
        dVar1 = local_68[uVar16];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          iVar18 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                             (iVar17,dVar1);
        }
        else {
          _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_80._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,(unsigned_long *)&local_80);
            p_Var7 = p_Stack_90;
            peVar6 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var9._M_head_impl;
          }
          bVar4 = (byte)uVar16 & 0x3f;
          _Var9._M_head_impl[uVar16 >> 6] =
               _Var9._M_head_impl[uVar16 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          iVar18 = iVar5;
        }
        ((interval_t *)(local_a0 + -1))->months = (int)iVar18._0_8_;
        ((interval_t *)(local_a0 + -1))->days = (int)((ulong)iVar18._0_8_ >> 0x20);
        *local_a0 = iVar18.micros;
        uVar16 = uVar16 + 1;
        local_a0 = local_a0 + 2;
      } while (count != uVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_40 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_70 = 0;
    uVar16 = 0;
    local_88 = mask;
    local_60 = count;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar14 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar14 = count;
        }
LAB_009b7e3f:
        uVar15 = uVar16;
        if (uVar16 < uVar14) {
          iVar5 = *local_78;
          iVar17 = *local_78;
          piVar11 = &result_data[uVar16].micros;
          do {
            dVar1 = local_68[uVar16];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              iVar18 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (iVar17,dVar1);
            }
            else {
              _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                local_80._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,(unsigned_long *)&local_80);
                p_Var7 = p_Stack_90;
                peVar6 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar6;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var7;
                if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_40);
                _Var9._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var9._M_head_impl;
              }
              bVar4 = (byte)uVar16 & 0x3f;
              _Var9._M_head_impl[uVar16 >> 6] =
                   _Var9._M_head_impl[uVar16 >> 6] &
                   (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              iVar18 = iVar5;
            }
            ((interval_t *)(piVar11 + -1))->months = (int)iVar18._0_8_;
            ((interval_t *)(piVar11 + -1))->days = (int)((ulong)iVar18._0_8_ >> 0x20);
            *piVar11 = iVar18.micros;
            uVar16 = uVar16 + 1;
            piVar11 = piVar11 + 2;
            count = local_60;
            uVar15 = uVar14;
          } while (uVar14 != uVar16);
        }
      }
      else {
        uVar12 = puVar2[local_70];
        uVar14 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar14 = count;
        }
        uVar15 = uVar14;
        if (uVar12 != 0) {
          if (uVar12 == 0xffffffffffffffff) goto LAB_009b7e3f;
          uVar13 = uVar14 - uVar16;
          uVar15 = uVar16;
          if (uVar16 <= uVar14 && uVar13 != 0) {
            piVar11 = &result_data[uVar16].micros;
            local_38 = local_68 + uVar16;
            uVar10 = 0;
            local_50 = uVar13;
            local_48 = uVar12;
            do {
              if ((uVar12 >> (uVar10 & 0x3f) & 1) != 0) {
                iVar17 = *local_78;
                dVar1 = local_38[uVar10];
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  iVar17 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                     (*local_78,dVar1);
                  uVar12 = local_48;
                  uVar13 = local_50;
                }
                else {
                  _Var9._M_head_impl =
                       (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                    local_80._M_head_impl =
                         (unsigned_long *)
                         (local_88->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,(unsigned_long *)&local_80);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (local_88->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (local_88->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (local_88->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_40);
                    _Var9._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var9._M_head_impl;
                    uVar12 = local_48;
                    uVar13 = local_50;
                  }
                  bVar4 = (byte)(uVar16 + uVar10) & 0x3f;
                  _Var9._M_head_impl[uVar16 + uVar10 >> 6] =
                       _Var9._M_head_impl[uVar16 + uVar10 >> 6] &
                       (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                }
                ((interval_t *)(piVar11 + -1))->months = (int)iVar17._0_8_;
                ((interval_t *)(piVar11 + -1))->days = (int)((ulong)iVar17._0_8_ >> 0x20);
                *piVar11 = iVar17.micros;
              }
              uVar10 = uVar10 + 1;
              piVar11 = piVar11 + 2;
              count = local_60;
              uVar15 = uVar14;
              mask = local_88;
            } while (uVar13 != uVar10);
          }
        }
      }
      local_70 = local_70 + 1;
      uVar16 = uVar15;
    } while (local_70 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}